

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_contexts.hpp
# Opt level: O0

void __thiscall timing_registry::startTask(timing_registry *this,uint64_t uid)

{
  uint32_t uVar1;
  mapped_type *pmVar2;
  mapped_type *h;
  lock_guard<std::recursive_mutex> __l;
  int64_t t;
  uint64_t uid_local;
  timing_registry *this_local;
  
  t = uid;
  uid_local = (uint64_t)this;
  __l._M_device = (mutex_type *)query_performance_counter();
  std::lock_guard<std::recursive_mutex>::lock_guard((lock_guard<std::recursive_mutex> *)&h,&this->m)
  ;
  pmVar2 = std::
           unordered_map<unsigned_long,_timing_registry::task_info,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_timing_registry::task_info>_>_>
           ::operator[](&this->tasks,(key_type *)&t);
  uVar1 = oqpi::this_thread::get_current_core();
  pmVar2->startedOnCore_ = uVar1;
  pmVar2->startedAt_ = (int64_t)__l._M_device;
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)&h);
  return;
}

Assistant:

void startTask(uint64_t uid)
    {
        auto t = query_performance_counter();
        std::lock_guard<std::recursive_mutex> __l(m);
        //oqpi_check(tasks.find(name) == tasks.end());
        auto &h = tasks[uid];
        h.startedOnCore_ = oqpi::this_thread::get_current_core();
        h.startedAt_ = t;
    }